

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
absl::lts_20240722::container_internal::
btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
::try_shrink(btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
             *this)

{
  btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
  *this_00;
  field_type fVar1;
  undefined1 *this_01;
  
  this_00 = this->root_;
  fVar1 = btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
          ::count(this_00);
  if (fVar1 != '\0') {
    return;
  }
  if (((ulong)this_00 & 7) == 0) {
    if (this_00[0xb] ==
        (btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
         )0x0) {
      fVar1 = btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
              ::start(this_00);
      this_01 = btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                ::child(this_00,fVar1);
      btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
      ::make_root((btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                   *)this_01);
    }
    else {
      if (this->size_ != 0) {
        __assert_fail("size() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                      ,0xadf,
                      "void absl::container_internal::btree<absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>>::try_shrink() [Params = absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>]"
                     );
      }
      this_01 = btree<absl::lts_20240722::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
                ::EmptyNode()::empty_node;
      (this->rightmost_).
      super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
      .
      super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_*,_2UL,_false>
      .value = (btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                *)btree<absl::lts_20240722::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
                  ::EmptyNode()::empty_node;
    }
    this->root_ = (node_type *)this_01;
    btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
    ::clear_and_delete(this_00,(allocator_type *)&this->rightmost_);
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<int, google::protobuf::internal::ExtensionSet::Extension>, absl::container_internal::btree_node<absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 7, 8>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<int, google::protobuf::internal::ExtensionSet::Extension>, absl::container_internal::btree_node<absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 7, 8>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
               );
}

Assistant:

void btree<P>::try_shrink() {
  node_type *orig_root = root();
  if (orig_root->count() > 0) {
    return;
  }
  // Deleted the last item on the root node, shrink the height of the tree.
  if (orig_root->is_leaf()) {
    assert(size() == 0);
    mutable_root() = mutable_rightmost() = EmptyNode();
  } else {
    node_type *child = orig_root->start_child();
    child->make_root();
    mutable_root() = child;
  }
  node_type::clear_and_delete(orig_root, mutable_allocator());
}